

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::IfcRampFlightType(IfcRampFlightType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcRampFlightType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00833428);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8332f8;
  *(undefined8 *)&this->field_0x1c0 = 0x833410;
  *(undefined8 *)&this->field_0x88 = 0x833320;
  *(undefined8 *)&this->field_0x98 = 0x833348;
  *(undefined8 *)&this->field_0xf0 = 0x833370;
  *(undefined8 *)&this->field_0x148 = 0x833398;
  *(undefined8 *)&this->field_0x180 = 0x8333c0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8333e8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}